

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptorwrapper.cpp
# Opt level: O1

off_t __thiscall DescriptorWrapper::seek(DescriptorWrapper *this,off_t offset,int whence)

{
  int iVar1;
  __off_t _Var2;
  runtime_error *this_00;
  int *piVar3;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  _Var2 = lseek(this->m_fd,offset,whence);
  if (_Var2 != -1) {
    return _Var2;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x18);
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Error while lseek","");
  std::runtime_error::runtime_error(this_00,(string *)local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_00108d90;
  *(int *)(this_00 + 0x10) = iVar1;
  __cxa_throw(this_00,&PosixException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

off_t DescriptorWrapper::seek(off_t offset, int whence) 
{
	off_t offt = lseek(m_fd, offset, whence);
	if (offt == (off_t)(-1))
		throw PosixException(errno, "Error while lseek");
	return offt;
}